

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<const_jsoncons::detail::to_integer_result<long,_char>_&>::
streamReconstructedExpression
          (UnaryExpr<const_jsoncons::detail::to_integer_result<long,_char>_&> *this,ostream *os)

{
  ostream *in_RSI;
  to_integer_result<long,_char> *in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  Detail::stringify<jsoncons::detail::to_integer_result<long,char>>(in_stack_ffffffffffffffa8);
  std::operator<<(in_RSI,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }